

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

bool read_input_content(string *filename,string *input)

{
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  istreambuf_iterator<char,_std::char_traits<char>_> __first_00;
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  istreambuf_iterator<char,_std::char_traits<char>_> *in_RSI;
  undefined8 in_RDI;
  string msg_1;
  string msg;
  ifstream f;
  undefined7 in_stack_fffffffffffffd18;
  undefined1 in_stack_fffffffffffffd1f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd20;
  undefined7 in_stack_fffffffffffffd28;
  undefined1 in_stack_fffffffffffffd2f;
  istreambuf_iterator<char,_std::char_traits<char>_> *in_stack_fffffffffffffd30;
  istreambuf_iterator<char,_std::char_traits<char>_> *this;
  string local_2b8 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd60;
  char *in_stack_fffffffffffffd68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd70;
  istreambuf_iterator<char,_std::char_traits<char>_> in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  int iVar4;
  undefined8 in_stack_fffffffffffffd90;
  istreambuf_iterator<char,_std::char_traits<char>_> local_240 [34];
  istreambuf_iterator<char,_std::char_traits<char>_> *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  bVar1 = std::operator==(in_stack_fffffffffffffd20,
                          (char *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
  if (bVar1) {
    std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
              (in_stack_fffffffffffffd30,
               (istream_type *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
    std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
              ((istreambuf_iterator<char,_std::char_traits<char>_> *)in_stack_fffffffffffffd20);
    __first._M_sbuf._4_4_ = in_stack_fffffffffffffd8c;
    __first._M_sbuf._0_4_ = in_stack_fffffffffffffd88;
    __first._8_8_ = in_stack_fffffffffffffd90;
    std::__cxx11::string::assign<std::istreambuf_iterator<char,std::char_traits<char>>,void>
              (in_stack_fffffffffffffd70,__first,in_stack_fffffffffffffd78);
  }
  else {
    this = local_240;
    std::ifstream::ifstream(this);
    std::ifstream::open(this,in_RDI,8);
    bVar2 = std::ios::good();
    if ((bVar2 & 1) == 0) {
      std::operator+(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      perror(pcVar3);
      local_1 = 0;
      iVar4 = 1;
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd90);
    }
    else {
      std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
                (this,(istream_type *)CONCAT17(bVar2,in_stack_fffffffffffffd28));
      std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator(local_18);
      __first_00._M_sbuf._4_4_ = in_stack_fffffffffffffd8c;
      __first_00._M_sbuf._0_4_ = in_stack_fffffffffffffd88;
      __first_00._8_8_ = in_stack_fffffffffffffd90;
      std::__cxx11::string::assign<std::istreambuf_iterator<char,std::char_traits<char>>,void>
                (in_stack_fffffffffffffd70,__first_00,in_stack_fffffffffffffd78);
      bVar2 = std::ios::good();
      if ((bVar2 & 1) == 0) {
        std::operator+(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        perror(pcVar3);
        local_1 = 0;
        iVar4 = 1;
        std::__cxx11::string::~string(local_2b8);
      }
      else {
        iVar4 = 0;
      }
    }
    std::ifstream::~ifstream(local_240);
    if (iVar4 != 0) goto LAB_001da7c9;
  }
  local_1 = 1;
LAB_001da7c9:
  return (bool)(local_1 & 1);
}

Assistant:

bool read_input_content(std::string filename, std::string *input)
{
    // Input file "-" tells Jsonnet to read stdin.
    if (filename == "-") {
        input->assign(std::istreambuf_iterator<char>(std::cin), std::istreambuf_iterator<char>());
    } else {
        std::ifstream f;
        f.open(filename);
        if (!f.good()) {
            std::string msg = "Opening input file: " + filename;
            perror(msg.c_str());
            return false;
        }
        input->assign(std::istreambuf_iterator<char>(f), std::istreambuf_iterator<char>());
        if (!f.good()) {
            std::string msg = "Reading input file: " + filename;
            perror(msg.c_str());
            return false;
        }
    }
    return true;
}